

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha1_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  SHA1_CTX context;
  SHA1_CTX local_88;
  
  local_88.state[0] = 0x67452301;
  local_88.state[1] = 0xefcdab89;
  local_88.state[2] = 0x98badcfe;
  local_88.state[3] = 0x10325476;
  local_88.state[4] = 0xc3d2e1f0;
  memzero(local_88.buffer,0x40);
  local_88.bitcount = 0;
  sha1_Update(&local_88,data,len);
  sha1_Final(&local_88,digest);
  return;
}

Assistant:

void sha1_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA1_DIGEST_LENGTH]) {
    trezor::SHA1_CTX	context;
	sha1_Init(&context);
	sha1_Update(&context, data, len);
	sha1_Final(&context, digest);
}